

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit,int step)

{
  pointer pvVar1;
  pointer pvVar2;
  initializer_list<int> __l;
  allocator_type local_61;
  int local_60;
  int local_5c;
  CheckHandler local_58;
  CheckHandler local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  pvVar1 = (this->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = step;
  if (((pvVar1 != pvVar2) &&
      ((~((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
         (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start) & 0x3fffffffcU) != 0)) &&
     ((pvVar1 == pvVar2 ||
      (((long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start & 0x3fffffffcU) != 4)))) {
    CheckHandler::CheckHandler
              ((CheckHandler *)&local_48,"ArgsCnt() == -1 || ArgsCnt() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"DenseRange",0x217);
    CheckHandler::~CheckHandler((CheckHandler *)&local_48);
  }
  GetNullLogInstance();
  if (start < 0) {
    CheckHandler::CheckHandler
              (&local_50,"(start) >= (0)",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"DenseRange",0x218);
    CheckHandler::~CheckHandler(&local_50);
  }
  GetNullLogInstance();
  if (limit < start) {
    CheckHandler::CheckHandler
              (&local_58,"(start) <= (limit)",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"DenseRange",0x219);
    CheckHandler::~CheckHandler(&local_58);
  }
  GetNullLogInstance();
  do {
    __l._M_len = 1;
    __l._M_array = &local_5c;
    local_5c = start;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,&local_61);
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->args_,&local_48);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    start = start + local_60;
  } while (start <= limit);
  return;
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit, int step) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg+= step) {
    args_.push_back({arg});
  }
}